

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O0

int __thiscall
CILPSolver::Solve(CILPSolver *this,int iOption,double *pObjectValue,double *pVariableValue)

{
  int iVar1;
  double dVar2;
  int local_48;
  int local_44;
  int i_3;
  int i_2;
  int iNumVariable;
  int i_1;
  int i;
  int iResult;
  double *pVariableValue_local;
  double *pObjectValue_local;
  int iOption_local;
  CILPSolver *this_local;
  
  glp_lpx_set_obj_dir(this->m_pLPX,(uint)iOption >> 0x18 & 1 | 0x78);
  pObjectValue_local._6_2_ = (ushort)((uint)iOption >> 0x10) & 0xfcff;
  glp_lpx_set_int_parm(this->m_pLPX,0x134,1);
  glp_lpx_set_int_parm(this->m_pLPX,300,1);
  glp_lpx_set_int_parm(this->m_pLPX,0x13a,1000);
  if (pObjectValue_local._6_2_ == 1) {
    glp_lpx_set_int_parm(this->m_pLPX,0x147,1);
    glp_lpx_adv_basis((LPX_conflict *)this->m_pLPX);
    i_1 = glp_lpx_simplex((LPX_conflict *)this->m_pLPX);
    if (i_1 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar2 = glp_lpx_get_obj_val(this->m_pLPX);
        *pObjectValue = dVar2;
      }
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        for (iNumVariable = 1; (double)iNumVariable <= *pVariableValue;
            iNumVariable = iNumVariable + 1) {
          dVar2 = glp_lpx_get_col_prim(this->m_pLPX,iNumVariable);
          pVariableValue[iNumVariable] = dVar2;
        }
      }
    }
  }
  else if (pObjectValue_local._6_2_ == 2) {
    i_1 = glp_lpx_interior((LPX_conflict *)this->m_pLPX);
    if (i_1 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar2 = glp_lpx_ipt_obj_val(this->m_pLPX);
        *pObjectValue = dVar2;
      }
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        for (i_2 = 1; (double)i_2 <= *pVariableValue; i_2 = i_2 + 1) {
          dVar2 = glp_lpx_ipt_col_prim(this->m_pLPX,i_2);
          pVariableValue[i_2] = dVar2;
        }
      }
    }
  }
  else {
    if (pObjectValue_local._6_2_ != 0x10) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                    ,0x109,"int CILPSolver::Solve(int, double *, double *)");
    }
    glp_lpx_set_class(this->m_pLPX,0x65);
    iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
    for (local_44 = 1; local_44 <= iVar1; local_44 = local_44 + 1) {
      glp_lpx_set_col_kind(this->m_pLPX,local_44,0xa1);
    }
    glp_lpx_set_int_parm(this->m_pLPX,0x149,0xff);
    glp_lpx_set_real_parm(this->m_pLPX,0x139,1800.0);
    glp_lpx_set_int_parm(this->m_pLPX,0x134,1);
    glp_lpx_set_int_parm(this->m_pLPX,300,1);
    glp_lpx_set_int_parm(this->m_pLPX,0x13a,1000);
    i_1 = glp_lpx_intopt((LPX_conflict *)this->m_pLPX);
    if (i_1 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar2 = glp_lpx_mip_obj_val(this->m_pLPX);
        *pObjectValue = dVar2;
      }
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        for (local_48 = 1; (double)local_48 <= *pVariableValue; local_48 = local_48 + 1) {
          dVar2 = glp_lpx_mip_col_val(this->m_pLPX,local_48);
          pVariableValue[local_48] = dVar2;
        }
      }
    }
    else {
      printf("\n\tlpx_intopt..failed (%d)\n",(ulong)(uint)i_1);
    }
  }
  switch(i_1) {
  case 200:
    return 1;
  case 0xc9:
    printf("ILP error: empty problem\n");
    break;
  case 0xca:
    printf("ILP error: invalid initial basis\n");
    break;
  case 0xcb:
    printf("ILP error: infeasible initial solution\n");
    break;
  case 0xcc:
    printf("ILP error: unable to start the search\n");
    break;
  case 0xcd:
    printf("ILP error: objective lower limit reached\n");
    break;
  case 0xce:
    printf("ILP error: objective upper limit reached\n");
    break;
  case 0xcf:
    printf("ILP error: iterations limit exhausted\n");
    break;
  case 0xd0:
    printf("ILP error: time limit exhausted\n");
    break;
  case 0xd1:
    printf("ILP error: no feasible solution\n");
    break;
  case 0xd2:
    printf("ILP error: numerical instability\n");
    break;
  case 0xd3:
    printf("ILP error: problems with basis matrix\n");
    break;
  case 0xd4:
    printf("ILP error: no convergence (interior)\n");
    break;
  case 0xd5:
    printf("ILP error: no primal feas. sol. (LP presolver)\n");
    break;
  case 0xd6:
    printf("ILP error: no dual feas. sol. (LP presolver)\n");
    break;
  default:
    printf("ILP error: unknown error code (%d)\n",(ulong)(uint)i_1);
  }
  return 0;
}

Assistant:

int CILPSolver::Solve(int iOption,double* pObjectValue,double* pVariableValue)
{
	lpx_set_obj_dir(m_pLPX, iOption&SOL_OPTION_MAX? LPX_MAX:LPX_MIN);

	iOption	&=	~SOL_OPTION_MAX;
	iOption	&=	~SOL_OPTION_MIN;
	
	int	iResult;

	lpx_set_int_parm(m_pLPX,LPX_K_ROUND,1);
	lpx_set_int_parm(m_pLPX,LPX_K_MSGLEV,1);
	lpx_set_int_parm(m_pLPX,LPX_K_OUTFRQ,1000);
	
	switch(iOption&0xFFFF0000) {
	case SOL_OPTION_SIMPLEX:
		lpx_set_int_parm(m_pLPX,LPX_K_PRESOL,1);
		lpx_adv_basis(m_pLPX);
		iResult	=	lpx_simplex(m_pLPX);
		if(iResult==LPX_E_OK)
		{
			if(pObjectValue)	*pObjectValue	=	lpx_get_obj_val(m_pLPX);
			if(pVariableValue)	
			{
				pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);
				for(int i=1;i<=pVariableValue[0];++i)
				{
					pVariableValue[i]	=	lpx_get_col_prim(m_pLPX,i);
				}				
			}
		}
		break;
	case SOL_OPTION_IPT:
		iResult	=	lpx_interior(m_pLPX);
		if(iResult==LPX_E_OK)
		{
			if(pObjectValue)	*pObjectValue	=	lpx_ipt_obj_val(m_pLPX);
			if(pVariableValue)	
			{
				pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);
				for(int i=1;i<=pVariableValue[0];++i)
				{
					pVariableValue[i]	=	lpx_ipt_col_prim(m_pLPX,i);
				}				
			}
		}
		break;
	case SOL_OPTION_MIP:
		{
			lpx_set_class(m_pLPX,LPX_MIP);

			int	iNumVariable	=	lpx_get_num_cols(m_pLPX);			
			for(int i=1;i<=iNumVariable;++i)	lpx_set_col_kind(m_pLPX,i,LPX_IV);

			lpx_set_int_parm(m_pLPX,LPX_K_USECUTS,LPX_C_ALL);
			lpx_set_real_parm(m_pLPX,LPX_K_TMLIM,1800);	
			lpx_set_int_parm(m_pLPX,LPX_K_ROUND,1);
			lpx_set_int_parm(m_pLPX,LPX_K_MSGLEV,1);
			lpx_set_int_parm(m_pLPX,LPX_K_OUTFRQ,1000);

			iResult	=	lpx_intopt(m_pLPX);
			if(iResult==LPX_E_OK)
			{
				if(pObjectValue)	*pObjectValue	=	lpx_mip_obj_val(m_pLPX);
				if(pVariableValue)	
				{
					pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);	
					for(int i=1;i<=pVariableValue[0];++i)	pVariableValue[i]	=	lpx_mip_col_val(m_pLPX,i);
				}
			}	
			else
			{
				printf("\n\tlpx_intopt..failed (%d)\n",iResult);
			}
		}
		break;
	default:
		assert(false);
		break;
	}
	
	switch(iResult) {
	case LPX_E_OK     : 
		return	1;
		break;
	case LPX_E_EMPTY  : printf("ILP error: empty problem\n");break;
	case LPX_E_BADB   : printf("ILP error: invalid initial basis\n");break;
	case LPX_E_INFEAS : printf("ILP error: infeasible initial solution\n");break;
	case LPX_E_FAULT  : printf("ILP error: unable to start the search\n");break;
	case LPX_E_OBJLL  : printf("ILP error: objective lower limit reached\n");break;
	case LPX_E_OBJUL  : printf("ILP error: objective upper limit reached\n");break;
	case LPX_E_ITLIM  : printf("ILP error: iterations limit exhausted\n");break;
	case LPX_E_TMLIM  : printf("ILP error: time limit exhausted\n");break;
	case LPX_E_NOFEAS : printf("ILP error: no feasible solution\n");break;
	case LPX_E_INSTAB : printf("ILP error: numerical instability\n");break;
	case LPX_E_SING   : printf("ILP error: problems with basis matrix\n");break;
	case LPX_E_NOCONV : printf("ILP error: no convergence (interior)\n");break;
	case LPX_E_NOPFS  : printf("ILP error: no primal feas. sol. (LP presolver)\n");break;
	case LPX_E_NODFS  : printf("ILP error: no dual feas. sol. (LP presolver)\n");break;
	default:			printf("ILP error: unknown error code (%d)\n",iResult);break;
	}

	return	0;
}